

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O1

void __thiscall Fl_Window::show(Fl_Window *this,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  Fl_Widget *pFVar3;
  int iVar4;
  uint uVar5;
  Fl_Window *pFVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  Window WVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int i;
  uint gh;
  uint gw;
  int gy;
  
  if ((argc != 0) && ((arg_called & 1) == 0)) {
    iVar4 = Fl::args(argc,argv,&i,(Fl_Args_Handler)0x0);
    if (iVar4 < argc) {
      (*Fl::error)(
                  "options are:\n -bg2 color\n -bg color\n -di[splay] host:n.n\n -dn[d]\n -fg color\n -g[eometry] WxH+X+Y\n -i[conic]\n -k[bd]\n -na[me] classname\n -nod[nd]\n -nok[bd]\n -not[ooltips]\n -s[cheme] scheme\n -ti[tle] windowtitle\n -to[oltips]"
                  );
    }
  }
  Fl::get_system_colors();
  pFVar6 = Fl::first_window();
  if (pFVar6 == (Fl_Window *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pFVar6 = Fl::first_window();
    pcVar7 = xclass(pFVar6);
  }
  pcVar9 = "fltk";
  if (pcVar7 != (char *)0x0) {
    pcVar9 = pcVar7;
  }
  pcVar7 = (char *)XGetDefault(fl_display,pcVar9,"dndTextOps");
  if (pcVar7 != (char *)0x0) {
    iVar4 = strcasecmp(pcVar7,"true");
    bVar14 = true;
    if (iVar4 != 0) {
      iVar4 = strcasecmp(pcVar7,"on");
      if (iVar4 != 0) {
        iVar4 = strcasecmp(pcVar7,"yes");
        bVar14 = iVar4 == 0;
      }
    }
    Fl::option(OPTION_DND_TEXT,bVar14);
  }
  pcVar7 = (char *)XGetDefault(fl_display,pcVar9,"tooltips");
  if (pcVar7 != (char *)0x0) {
    iVar4 = strcasecmp(pcVar7,"true");
    bVar14 = true;
    if (iVar4 != 0) {
      iVar4 = strcasecmp(pcVar7,"on");
      if (iVar4 != 0) {
        iVar4 = strcasecmp(pcVar7,"yes");
        bVar14 = iVar4 == 0;
      }
    }
    Fl::option(OPTION_SHOW_TOOLTIPS,bVar14);
  }
  pcVar7 = (char *)XGetDefault(fl_display,pcVar9,"visibleFocus");
  if (pcVar7 != (char *)0x0) {
    iVar4 = strcasecmp(pcVar7,"true");
    bVar14 = true;
    if (iVar4 != 0) {
      iVar4 = strcasecmp(pcVar7,"on");
      if (iVar4 != 0) {
        iVar4 = strcasecmp(pcVar7,"yes");
        bVar14 = iVar4 == 0;
      }
    }
    Fl::option(OPTION_VISIBLE_FOCUS,bVar14);
  }
  if (geometry != (char *)0x0 && (show(int,char**)::beenhere & 1) == 0) {
    i = (this->super_Fl_Group).super_Fl_Widget.x_;
    gy = (this->super_Fl_Group).super_Fl_Widget.y_;
    gw = (this->super_Fl_Group).super_Fl_Widget.w_;
    gh = (this->super_Fl_Group).super_Fl_Widget.h_;
    uVar5 = XParseGeometry();
    if ((uVar5 & 0x10) != 0) {
      iVar4 = Fl::w();
      i = i + (iVar4 - (this->super_Fl_Group).super_Fl_Widget.w_);
    }
    if ((uVar5 & 0x20) != 0) {
      iVar4 = Fl::h();
      gy = gy + (iVar4 - (this->super_Fl_Group).super_Fl_Widget.h_);
    }
    pFVar3 = (this->super_Fl_Group).resizable_;
    if (pFVar3 == (Fl_Widget *)0x0) {
      (this->super_Fl_Group).resizable_ = (Fl_Widget *)this;
    }
    if ((uVar5 & 3) == 0) {
      uVar5 = (this->super_Fl_Group).super_Fl_Widget.x_;
      uVar2 = (this->super_Fl_Group).super_Fl_Widget.y_;
    }
    else {
      (this->super_Fl_Group).super_Fl_Widget.x_ = -1;
      uVar2 = gy;
      uVar5 = i;
    }
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
              (this,(ulong)uVar5,(ulong)uVar2,(ulong)gw,(ulong)gh);
    (this->super_Fl_Group).resizable_ = pFVar3;
  }
  if (::name == (char *)0x0) {
    pcVar7 = xclass(this);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = fl_filename_name(*argv);
      xclass(this,pcVar7);
    }
  }
  else {
    xclass(this,::name);
    ::name = (char *)0x0;
  }
  if (title == (char *)0x0) {
    if ((this->super_Fl_Group).super_Fl_Widget.label_.value == (char *)0x0) {
      pcVar7 = xclass(this);
      label(this,pcVar7);
    }
  }
  else {
    label(this,title);
    title = (char *)0x0;
  }
  if (show(int,char**)::beenhere == 0) {
    show(int,char**)::beenhere = 1;
    Fl::scheme(Fl::scheme_);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
  uVar13 = 0;
  if (0 < argc) {
    uVar12 = 0;
    do {
      sVar8 = strlen(argv[uVar12]);
      uVar5 = (int)uVar13 + (int)sVar8 + 1;
      uVar13 = (ulong)uVar5;
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
    uVar13 = (ulong)(int)uVar5;
  }
  pcVar9 = (char *)operator_new__(uVar13);
  pcVar7 = pcVar9;
  if (0 < argc) {
    uVar13 = 0;
    do {
      pcVar10 = argv[uVar13];
      do {
        cVar1 = *pcVar10;
        pcVar10 = pcVar10 + 1;
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + 1;
      } while (cVar1 != '\0');
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)argc);
  }
  if (this->i == (Fl_X *)0x0) {
    WVar11 = 0;
  }
  else {
    WVar11 = this->i->xid;
  }
  XChangeProperty(fl_display,WVar11,0x22,0x1f,8,0,pcVar9,(int)pcVar7 + ~(uint)pcVar9);
  operator_delete__(pcVar9);
  return;
}

Assistant:

void Fl_Window::show(int argc, char **argv) {
  if (argc && !arg_called) Fl::args(argc,argv);

  Fl::get_system_colors();

#if !defined(WIN32) && !defined(__APPLE__)
  // Get defaults for drag-n-drop and focus...
  const char *key = 0, *val;

  if (Fl::first_window()) key = Fl::first_window()->xclass();
  if (!key) key = "fltk";

  val = XGetDefault(fl_display, key, "dndTextOps");
  if (val) Fl::dnd_text_ops(strcasecmp(val, "true") == 0 ||
                            strcasecmp(val, "on") == 0 ||
                            strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "tooltips");
  if (val) Fl_Tooltip::enable(strcasecmp(val, "true") == 0 ||
                              strcasecmp(val, "on") == 0 ||
                              strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "visibleFocus");
  if (val) Fl::visible_focus(strcasecmp(val, "true") == 0 ||
                             strcasecmp(val, "on") == 0 ||
                             strcasecmp(val, "yes") == 0);
#endif // !WIN32 && !__APPLE__

  // set colors first, so background_pixel is correct:
  static char beenhere;
  if (!beenhere) {
    if (geometry) {
      int fl = 0, gx = x(), gy = y(); unsigned int gw = w(), gh = h();
      fl = XParseGeometry(geometry, &gx, &gy, &gw, &gh);
      if (fl & XNegative) gx = Fl::w()-w()+gx;
      if (fl & YNegative) gy = Fl::h()-h()+gy;
      //  int mw,mh; minsize(mw,mh);
      //  if (mw > gw) gw = mw;
      //  if (mh > gh) gh = mh;
      Fl_Widget *r = resizable();
      if (!r) resizable(this);
      // for WIN32 we assume window is not mapped yet:
      if (fl & (XValue | YValue))
	x(-1), resize(gx,gy,gw,gh);
      else
	size(gw,gh);
      resizable(r);
    }
  }

  // set the class, which is used by X version of get_system_colors:
  if (name) {xclass(name); name = 0;}
  else if (!xclass()) xclass(fl_filename_name(argv[0]));

  if (title) {label(title); title = 0;}
  else if (!label()) label(xclass());

  if (!beenhere) {
    beenhere = 1;
    Fl::scheme(Fl::scheme()); // opens display!  May call Fl::fatal()
  }

  // Show the window AFTER we have set the colors and scheme.
  show();

#if !defined(WIN32) && !defined(__APPLE__)
  // set the command string, used by state-saving window managers:
  int j;
  int n=0; for (j=0; j<argc; j++) n += strlen(argv[j])+1;
  char *buffer = new char[n];
  char *p = buffer;
  for (j=0; j<argc; j++) for (const char *q = argv[j]; (*p++ = *q++););
  XChangeProperty(fl_display, fl_xid(this), XA_WM_COMMAND, XA_STRING, 8, 0,
		  (unsigned char *)buffer, p-buffer-1);
  delete[] buffer;
#endif // !WIN32 && !__APPLE__
}